

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O0

bool __thiscall CNetAddr::IsAddrV1Compatible(CNetAddr *this)

{
  int iVar1;
  long in_RDI;
  long in_FS_OFFSET;
  bool local_9;
  
  iVar1 = *(int *)(in_RDI + 0x18);
  if (iVar1 == 0) {
LAB_0197e5cc:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netaddress.cpp"
                  ,0x1ee,"bool CNetAddr::IsAddrV1Compatible() const");
  }
  if (1 < iVar1 - 1U) {
    if (iVar1 - 3U < 3) {
      local_9 = false;
      goto LAB_0197e60a;
    }
    if (iVar1 != 6) {
      if (iVar1 != 7) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netaddress.cpp"
                      ,0x1f1,"bool CNetAddr::IsAddrV1Compatible() const");
      }
      goto LAB_0197e5cc;
    }
  }
  local_9 = true;
LAB_0197e60a:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return local_9;
  }
  __stack_chk_fail();
}

Assistant:

bool CNetAddr::IsAddrV1Compatible() const
{
    switch (m_net) {
    case NET_IPV4:
    case NET_IPV6:
    case NET_INTERNAL:
        return true;
    case NET_ONION:
    case NET_I2P:
    case NET_CJDNS:
        return false;
    case NET_UNROUTABLE: // m_net is never and should not be set to NET_UNROUTABLE
    case NET_MAX:        // m_net is never and should not be set to NET_MAX
        assert(false);
    } // no default case, so the compiler can warn about missing cases

    assert(false);
}